

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

void __thiscall ProfileHandler::RegisterThread(ProfileHandler *this)

{
  SpinLockHolder local_18;
  SpinLockHolder cl;
  ProfileHandler *this_local;
  
  cl.lock_ = (SpinLock *)this;
  SpinLockHolder::SpinLockHolder(&local_18,&this->control_lock_);
  if ((this->allowed_ & 1U) != 0) {
    if ((this->per_thread_timer_enabled_ & 1U) == 0) {
      UpdateTimer(this,0 < this->callback_count_);
    }
    else {
      StartLinuxThreadTimer
                (this->timer_type_,this->signal_number_,this->frequency_,this->thread_timer_key);
    }
  }
  SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

void ProfileHandler::RegisterThread() {
  SpinLockHolder cl(&control_lock_);

  if (!allowed_) {
    return;
  }

  // Record the thread identifier and start the timer if profiling is on.
#if HAVE_LINUX_SIGEV_THREAD_ID
  if (per_thread_timer_enabled_) {
    StartLinuxThreadTimer(timer_type_, signal_number_, frequency_,
                          thread_timer_key);
    return;
  }
#endif
  UpdateTimer(callback_count_ > 0);
}